

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

int evmap_reinit_(event_base *base)

{
  long *plVar1;
  eventop *peVar2;
  size_t __n;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  if ((base->io).nentries < 1) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    lVar7 = 0;
    do {
      plVar1 = (long *)(base->io).entries[lVar7];
      if (plVar1 != (long *)0x0) {
        bVar8 = (short)plVar1[1] != 0;
        peVar2 = base->evsel;
        uVar3 = bVar8 + 4 + (ushort)bVar8;
        if (*(short *)((long)plVar1 + 10) == 0) {
          uVar3 = (ushort)bVar8 * 2;
        }
        uVar5 = uVar3 + 0x80;
        if (*(short *)((long)plVar1 + 0xc) == 0) {
          uVar5 = uVar3;
        }
        __n = peVar2->fdinfo_len;
        if (__n != 0) {
          memset(plVar1 + 2,0,__n);
        }
        if ((uVar5 != 0) && (*plVar1 != 0)) {
          uVar5 = uVar5 | *(ushort *)(*plVar1 + 0x68) & 0x20;
        }
        iVar4 = (*peVar2->add)(base,(int)lVar7,0,uVar5,plVar1 + 2);
        if (iVar4 == -1) {
          iVar6 = -1;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (base->io).nentries);
  }
  if (iVar6 < 0) {
    iVar6 = -1;
  }
  else {
    if (0 < (base->sigmap).nentries) {
      lVar7 = 0;
      do {
        plVar1 = (long *)(base->sigmap).entries[lVar7];
        if (((plVar1 != (long *)0x0) && (*plVar1 != 0)) &&
           (iVar4 = (*base->evsigsel->add)(base,(int)lVar7,0,8,(void *)0x0), iVar4 == -1)) {
          iVar6 = -1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (base->sigmap).nentries);
    }
    iVar6 = iVar6 >> 0x1f;
  }
  return iVar6;
}

Assistant:

int
evmap_reinit_(struct event_base *base)
{
	int result = 0;

	evmap_io_foreach_fd(base, evmap_io_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	evmap_signal_foreach_signal(base, evmap_signal_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	return 0;
}